

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::setting_args::test_method(setting_args *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffba48;
  char *in_stack_ffffffffffffba50;
  char *in_stack_ffffffffffffba58;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffba60;
  VType in_stack_ffffffffffffba64;
  UniValue *in_stack_ffffffffffffba68;
  undefined6 in_stack_ffffffffffffba70;
  undefined1 in_stack_ffffffffffffba76;
  undefined1 in_stack_ffffffffffffba77;
  string *in_stack_ffffffffffffba78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffba80;
  ArgsManager *in_stack_ffffffffffffba88;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffba90;
  undefined1 in_stack_ffffffffffffba96;
  undefined1 in_stack_ffffffffffffba97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffba98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ArgsManager *in_stack_ffffffffffffbaa0;
  ArgsManager *local_3a88;
  runtime_error *ex_14;
  runtime_error *ex_13;
  runtime_error *ex_12;
  runtime_error *ex_11;
  runtime_error *ex_10;
  runtime_error *ex_9;
  runtime_error *ex_8;
  runtime_error *ex_7;
  runtime_error *ex_6;
  runtime_error *ex_5;
  runtime_error *ex_4;
  runtime_error *ex_3;
  runtime_error *ex_2;
  runtime_error *ex_1;
  runtime_error *ex;
  setting_args *this_local;
  undefined1 local_390b [3];
  undefined1 local_3908 [85];
  undefined1 local_38b3 [3];
  undefined1 local_38b0 [80];
  undefined1 local_3860 [8];
  undefined8 local_3858;
  undefined1 local_3850 [16];
  undefined1 local_3840 [70];
  allocator<char> local_37fa;
  allocator<char> local_37f9;
  undefined1 local_37f8 [16];
  undefined1 local_37e8 [71];
  allocator<char> local_37a1;
  undefined1 local_37a0 [16];
  undefined1 local_3790 [168];
  const_string local_36e8;
  lazy_ostream local_36d8 [2];
  assertion_result local_36b8 [2];
  allocator<char> local_3679 [137];
  const_string local_35f0;
  lazy_ostream local_35e0 [2];
  assertion_result local_35c0 [2];
  allocator<char> local_3581 [137];
  const_string local_34f8;
  lazy_ostream local_34e8 [2];
  assertion_result local_34c8 [2];
  allocator<char> local_3489 [137];
  const_string local_3400;
  lazy_ostream local_33f0 [2];
  assertion_result local_33d0 [2];
  allocator<char> local_3392;
  allocator<char> local_3391 [40];
  allocator<char> local_3369;
  undefined1 local_3368 [16];
  undefined1 local_3358 [168];
  const_string local_32b0;
  lazy_ostream local_32a0 [2];
  assertion_result local_3280 [2];
  allocator<char> local_3241 [137];
  const_string local_31b8;
  lazy_ostream local_31a8 [2];
  assertion_result local_3188 [2];
  allocator<char> local_3149 [137];
  const_string local_30c0;
  lazy_ostream local_30b0 [2];
  assertion_result local_3090 [2];
  allocator<char> local_3051 [81];
  undefined8 local_3000;
  const_string local_2fc8;
  lazy_ostream local_2fb8 [2];
  assertion_result local_2f98 [2];
  allocator<char> local_2f5a;
  allocator<char> local_2f59 [40];
  allocator<char> local_2f31;
  undefined1 local_2f30 [16];
  undefined1 local_2f20 [69];
  undefined1 local_2edb [2];
  undefined1 local_2ed9;
  undefined1 local_2ed8 [16];
  undefined1 local_2ec8 [69];
  undefined1 local_2e83 [2];
  undefined1 local_2e81;
  undefined1 local_2e80 [16];
  undefined1 local_2e70 [64];
  undefined1 local_2e30 [8];
  undefined8 local_2e28;
  undefined1 local_2e20 [16];
  undefined1 local_2e10 [70];
  allocator<char> local_2dca;
  allocator<char> local_2dc9;
  undefined1 local_2dc8 [16];
  undefined1 local_2db8 [71];
  allocator<char> local_2d71;
  undefined1 local_2d70 [16];
  undefined1 local_2d60 [68];
  undefined1 local_2d1c;
  undefined1 local_2d1b [2];
  undefined1 local_2d19;
  undefined1 local_2d18 [16];
  undefined1 local_2d08 [69];
  undefined1 local_2cc3 [2];
  undefined1 local_2cc1;
  undefined1 local_2cc0 [16];
  undefined1 local_2cb0 [64];
  undefined1 local_2c70 [8];
  undefined8 local_2c68;
  undefined1 local_2c60 [16];
  undefined1 local_2c50 [70];
  allocator<char> local_2c0a;
  allocator<char> local_2c09;
  undefined1 local_2c08 [16];
  undefined1 local_2bf8 [71];
  allocator<char> local_2bb1;
  undefined1 local_2bb0 [16];
  undefined1 local_2ba0 [71];
  undefined1 local_2b59;
  const_string local_2af0;
  lazy_ostream local_2ae0 [2];
  assertion_result local_2ac0 [2];
  allocator<char> local_2a81 [137];
  const_string local_29f8;
  lazy_ostream local_29e8 [2];
  assertion_result local_29c8 [2];
  allocator<char> local_2989 [33];
  undefined1 local_2968 [8];
  undefined8 local_2960;
  undefined1 local_2958 [16];
  undefined1 local_2948 [70];
  allocator<char> local_2902;
  allocator<char> local_2901;
  undefined1 local_2900 [16];
  undefined1 local_28f0 [71];
  allocator<char> local_28a9;
  undefined1 local_28a8 [16];
  undefined1 local_2898 [68];
  undefined4 local_2854;
  const_string local_27e8;
  lazy_ostream local_27d8 [2];
  assertion_result local_27b8 [2];
  allocator<char> local_2779 [137];
  const_string local_26f0;
  lazy_ostream local_26e0 [2];
  assertion_result local_26c0 [2];
  allocator<char> local_2681 [137];
  const_string local_25f8;
  lazy_ostream local_25e8 [2];
  assertion_result local_25c8 [2];
  allocator<char> local_2589 [39];
  allocator<char> local_2562;
  allocator<char> local_2561;
  undefined1 local_2560 [16];
  undefined1 local_2550 [71];
  allocator<char> local_2509;
  undefined1 local_2508 [16];
  undefined1 local_24f8 [64];
  undefined8 local_24b8;
  const_string local_2448;
  lazy_ostream local_2438 [2];
  assertion_result local_2418 [2];
  allocator<char> local_23d9 [137];
  const_string local_2350;
  lazy_ostream local_2340 [2];
  assertion_result local_2320 [2];
  allocator<char> local_22e1 [33];
  undefined1 local_22c0 [8];
  undefined8 local_22b8;
  undefined1 local_22b0 [16];
  undefined1 local_22a0 [70];
  allocator<char> local_225a;
  allocator<char> local_2259;
  undefined1 local_2258 [16];
  undefined1 local_2248 [71];
  allocator<char> local_2201;
  undefined1 local_2200 [16];
  undefined1 local_21f0 [64];
  undefined4 local_21b0;
  undefined1 local_21ab [2];
  undefined1 local_21a9;
  undefined1 local_21a8 [16];
  undefined1 local_2198 [69];
  undefined1 local_2153 [2];
  undefined1 local_2151;
  undefined1 local_2150 [16];
  undefined1 local_2140 [64];
  undefined1 local_2100 [8];
  undefined8 local_20f8;
  undefined1 local_20f0 [16];
  undefined1 local_20e0 [70];
  allocator<char> local_209a;
  allocator<char> local_2099;
  undefined1 local_2098 [16];
  undefined1 local_2088 [71];
  allocator<char> local_2041;
  undefined1 local_2040 [16];
  undefined1 local_2030 [48];
  undefined8 local_2000;
  undefined1 local_1feb [2];
  undefined1 local_1fe9;
  undefined1 local_1fe8 [16];
  undefined1 local_1fd8 [69];
  undefined1 local_1f93 [2];
  undefined1 local_1f91;
  undefined1 local_1f90 [16];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [8];
  undefined8 local_1f38;
  undefined1 local_1f30 [16];
  undefined1 local_1f20 [70];
  allocator<char> local_1eda;
  allocator<char> local_1ed9;
  undefined1 local_1ed8 [16];
  undefined1 local_1ec8 [71];
  allocator<char> local_1e81;
  undefined1 local_1e80 [16];
  undefined1 local_1e70 [69];
  undefined1 local_1e2b [2];
  undefined1 local_1e29;
  undefined1 local_1e28 [16];
  undefined1 local_1e18 [69];
  undefined1 local_1dd3 [2];
  undefined1 local_1dd1;
  undefined1 local_1dd0 [16];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [8];
  undefined8 local_1d78;
  undefined1 local_1d70 [16];
  undefined1 local_1d60 [70];
  allocator<char> local_1d1a;
  allocator<char> local_1d19;
  undefined1 local_1d18 [16];
  undefined1 local_1d08 [71];
  allocator<char> local_1cc1;
  undefined1 local_1cc0 [16];
  undefined1 local_1cb0 [69];
  undefined1 local_1c6b [2];
  undefined1 local_1c69;
  undefined1 local_1c68 [16];
  undefined1 local_1c58 [69];
  undefined1 local_1c13 [2];
  undefined1 local_1c11;
  undefined1 local_1c10 [16];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [8];
  undefined8 local_1bb8;
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [70];
  allocator<char> local_1b5a;
  allocator<char> local_1b59;
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [71];
  allocator<char> local_1b01;
  undefined1 local_1b00 [16];
  undefined1 local_1af0 [69];
  undefined1 local_1aab [2];
  undefined1 local_1aa9;
  undefined1 local_1aa8 [16];
  undefined1 local_1a98 [69];
  undefined1 local_1a53 [2];
  undefined1 local_1a51;
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [8];
  undefined8 local_19f8;
  undefined1 local_19f0 [16];
  undefined1 local_19e0 [70];
  allocator<char> local_199a;
  allocator<char> local_1999;
  undefined1 local_1998 [16];
  undefined1 local_1988 [71];
  allocator<char> local_1941;
  undefined1 local_1940 [16];
  undefined1 local_1930 [64];
  anon_class_8_1_89897ddb set_foo;
  undefined1 local_1828 [64];
  undefined1 local_17e8 [88];
  UniValue local_1790 [4];
  undefined1 local_1618 [88];
  UniValue local_15c0 [4];
  undefined1 local_1448 [88];
  UniValue local_13f0 [3];
  undefined1 local_12b8 [64];
  undefined1 local_1278 [88];
  UniValue local_1220 [3];
  undefined1 local_1108 [64];
  undefined1 local_10c8 [88];
  UniValue local_1070;
  undefined8 local_1000;
  undefined1 local_f58 [64];
  undefined1 local_f18 [88];
  UniValue local_ec0 [3];
  undefined1 local_da8 [64];
  undefined1 local_d68 [88];
  UniValue local_d10 [3];
  undefined1 local_bf8 [64];
  undefined1 local_bb8 [88];
  UniValue local_b60 [3];
  undefined1 local_a48 [64];
  undefined1 local_a08 [88];
  UniValue local_9b0 [3];
  undefined1 local_898 [64];
  undefined1 local_858 [88];
  UniValue local_800 [3];
  undefined1 local_6e8 [64];
  undefined1 local_6a8 [88];
  UniValue local_650 [3];
  undefined1 local_538 [64];
  undefined1 local_4f8 [88];
  UniValue local_4a0 [3];
  undefined1 local_388 [64];
  undefined1 local_348 [88];
  UniValue local_2f0;
  undefined1 local_278 [40];
  ArgsManager args;
  
  local_1000 = 0;
  local_2000 = 0;
  local_3000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_ffffffffffffba48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[5],_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffba80,(char (*) [5])in_stack_ffffffffffffba78,
             (Flags *)CONCAT17(in_stack_ffffffffffffba77,
                               CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffba48);
  __l._M_array._6_1_ = in_stack_ffffffffffffba96;
  __l._M_array._0_6_ = in_stack_ffffffffffffba90;
  __l._M_array._7_1_ = in_stack_ffffffffffffba97;
  __l._M_len = (size_type)in_stack_ffffffffffffba98;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffba88,__l,(allocator_type *)in_stack_ffffffffffffba80);
  SetupArgs((ArgsManager *)
            CONCAT17(in_stack_ffffffffffffba97,
                     CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffba88);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffba58);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffba48);
  local_3a88 = &args;
  do {
    local_3a88 = (ArgsManager *)&local_3a88[-1].m_cached_network_datadir_path;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffffba48);
  } while (local_3a88 != (ArgsManager *)local_278);
  set_foo.args = &args;
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            ((UniValue *)
             CONCAT17(in_stack_ffffffffffffba97,
                      CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
             (char (*) [4])in_stack_ffffffffffffba88);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(&local_2f0,(int)local_348,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"\\\"str\\\"\"";
    in_stack_ffffffffffffba50 = "\"str\"";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_1930,local_1940,0x45,1,2,&local_2f0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1941);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"str\"";
    in_stack_ffffffffffffba50 = "str";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_1988,local_1998,0x46,1,2,local_388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_199a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1999);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_19f8 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_1a00._0_4_ = 0;
    in_stack_ffffffffffffba58 = "0";
    in_stack_ffffffffffffba50 = local_1a00;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_19e0,local_19f0,0x47,1,2,&local_19f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1a00 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1a51 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1a53[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_1a53;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1a40,local_1a50,0x48,1,2,&local_1a51);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1a53 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1aa9 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1aab[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_1aab;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1a98,local_1aa8,0x49,1,2,&local_1aa9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1aab + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::UniValue<const_char_(&)[3],_char[3],_true>
            ((UniValue *)
             CONCAT17(in_stack_ffffffffffffba97,
                      CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
             (char (*) [3])in_stack_ffffffffffffba88);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_4a0,(int)local_4f8,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"\\\"99\\\"\"";
    in_stack_ffffffffffffba50 = "\"99\"";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_1af0,local_1b00,0x4c,1,2,local_4a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1b01);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"99\"";
    in_stack_ffffffffffffba50 = "99";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_1b48,local_1b58,0x4d,1,2,local_538);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1b5a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1b59);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1bb8 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_1bc0._0_4_ = 99;
    in_stack_ffffffffffffba58 = "99";
    in_stack_ffffffffffffba50 = local_1bc0;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1ba0,local_1bb0,0x4e,1,2,&local_1bb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1bc0 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1c11 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1c13[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_1c13;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1c00,local_1c10,0x4f,1,2,&local_1c11);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1c13 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1c69 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1c6b[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_1c6b;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1c58,local_1c68,0x50,1,2,&local_1c69);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1c6b + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::UniValue<const_char_(&)[5],_char[5],_true>
            ((UniValue *)
             CONCAT17(in_stack_ffffffffffffba97,
                      CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
             (char (*) [5])in_stack_ffffffffffffba88);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_650,(int)local_6a8,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"\\\"3.25\\\"\"";
    in_stack_ffffffffffffba50 = "\"3.25\"";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_1cb0,local_1cc0,0x53,1,2,local_650);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1cc1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"3.25\"";
    in_stack_ffffffffffffba50 = "3.25";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_1d08,local_1d18,0x54,1,2,local_6e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1d1a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1d19);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1d78 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_1d80._0_4_ = 3;
    in_stack_ffffffffffffba58 = "3";
    in_stack_ffffffffffffba50 = local_1d80;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1d60,local_1d70,0x55,1,2,&local_1d78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1d80 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1dd1 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1dd3[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_1dd3;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1dc0,local_1dd0,0x56,1,2,&local_1dd1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1dd3 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1e29 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1e2b[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_1e2b;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1e18,local_1e28,0x57,1,2,&local_1e29);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1e2b + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            ((UniValue *)
             CONCAT17(in_stack_ffffffffffffba97,
                      CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
             (char (*) [2])in_stack_ffffffffffffba88);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_800,(int)local_858,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"\\\"0\\\"\"";
    in_stack_ffffffffffffba50 = "\"0\"";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_1e70,local_1e80,0x5a,1,2,local_800);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1e81);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"0\"";
    in_stack_ffffffffffffba50 = "0";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_1ec8,local_1ed8,0x5b,1,2,local_898);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1eda);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_1ed9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1f38 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_1f40._0_4_ = 0;
    in_stack_ffffffffffffba58 = "0";
    in_stack_ffffffffffffba50 = local_1f40;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1f20,local_1f30,0x5c,1,2,&local_1f38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1f40 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1f91 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1f93[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_1f93;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1f80,local_1f90,0x5d,1,2,&local_1f91);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1f93 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_1fe9 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_1feb[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_1feb;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_1fd8,local_1fe8,0x5e,1,2,&local_1fe9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_1feb + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            ((UniValue *)
             CONCAT17(in_stack_ffffffffffffba97,
                      CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
             (char (*) [1])in_stack_ffffffffffffba88);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_9b0,(int)local_a08,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"\\\"\\\"\"";
    in_stack_ffffffffffffba50 = "\"\"";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_2030,local_2040,0x61,1,2,local_9b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2041);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"\"";
    in_stack_ffffffffffffba50 = "";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_2088,local_2098,0x62,1,2,local_a48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_209a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2099);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_20f8 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_2100._0_4_ = 0;
    in_stack_ffffffffffffba58 = "0";
    in_stack_ffffffffffffba50 = local_2100;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_20e0,local_20f0,99,1,2,&local_20f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2100 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2151 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_2153[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_2153;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2140,local_2150,100,1,2,&local_2151);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2153 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_21a9 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_21ab[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_21ab;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2198,local_21a8,0x65,1,2,&local_21a9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_21ab + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_21b0 = 99;
  UniValue::UniValue<int,_int,_true>
            ((UniValue *)in_stack_ffffffffffffba88,(int *)in_stack_ffffffffffffba80);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_b60,(int)local_bb8,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"99\"";
    in_stack_ffffffffffffba50 = "99";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_21f0,local_2200,0x68,1,2,local_b60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2201);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"99\"";
    in_stack_ffffffffffffba50 = "99";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_2248,local_2258,0x69,1,2,local_bf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_225a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2259);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_22b8 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_22c0._0_4_ = 99;
    in_stack_ffffffffffffba58 = "99";
    in_stack_ffffffffffffba50 = local_22c0;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_22a0,local_22b0,0x6a,1,2,&local_22b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_22c0 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_22e1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2320,local_2340,&local_2350,0x6b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_23d9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2418,local_2438,&local_2448,0x6c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_24b8 = 0x400a000000000000;
  UniValue::UniValue<double,_double,_true>
            ((UniValue *)in_stack_ffffffffffffba88,(double *)in_stack_ffffffffffffba80);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_d10,(int)local_d68,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"3.25\"";
    in_stack_ffffffffffffba50 = "3.25";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_24f8,local_2508,0x6f,1,2,local_d10);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2509);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"3.25\"";
    in_stack_ffffffffffffba50 = "3.25";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_2550,local_2560,0x70,1,2,local_da8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2562);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2561);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetIntArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               (int64_t)in_stack_ffffffffffffba58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2589);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_25c8,local_25e8,&local_25f8,0x71,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2681);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_26c0,local_26e0,&local_26f0,0x72,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2779);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_27b8,local_27d8,&local_27e8,0x73,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2854 = 0;
  UniValue::UniValue<int,_int,_true>
            ((UniValue *)in_stack_ffffffffffffba88,(int *)in_stack_ffffffffffffba80);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_ec0,(int)local_f18,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"0\"";
    in_stack_ffffffffffffba50 = "0";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2898,local_28a8,0x76,1,2,local_ec0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_28a9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"0\"";
    in_stack_ffffffffffffba50 = "0";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_28f0,local_2900,0x77,1,2,local_f58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2902);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2901);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2960 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_2968._0_4_ = 0;
    in_stack_ffffffffffffba58 = "0";
    in_stack_ffffffffffffba50 = local_2968;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_2948,local_2958,0x78,1,2,&local_2960);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2968 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2989);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_29c8,local_29e8,&local_29f8,0x79,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2a81);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2ac0,local_2ae0,&local_2af0,0x7a,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2b59 = 1;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_ffffffffffffba88,(bool *)in_stack_ffffffffffffba80);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(&local_1070,(int)local_10c8,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"true\"";
    in_stack_ffffffffffffba50 = "true";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_2ba0,local_2bb0,0x7d,1,2,&local_1070);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2bb1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"1\"";
    in_stack_ffffffffffffba50 = "1";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2bf8,local_2c08,0x7e,1,2,local_1108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2c0a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2c09);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2c68 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_2c70._0_4_ = 1;
    in_stack_ffffffffffffba58 = "1";
    in_stack_ffffffffffffba50 = local_2c70;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_2c50,local_2c60,0x7f,1,2,&local_2c68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2c70 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2cc1 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_2cc3[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_2cc3;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2cb0,local_2cc0,0x80,1,2,&local_2cc1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2cc3 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2d19 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_2d1b[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_2d1b;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2d08,local_2d18,0x81,1,2,&local_2d19);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2d1b + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2d1c = 0;
  UniValue::UniValue<bool,_bool,_true>
            ((UniValue *)in_stack_ffffffffffffba88,(bool *)in_stack_ffffffffffffba80);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_1220,(int)local_1278,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"false\"";
    in_stack_ffffffffffffba50 = "false";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_2d60,local_2d70,0x84,1,2,local_1220);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2d71);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"0\"";
    in_stack_ffffffffffffba50 = "0";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_2db8,local_2dc8,0x85,1,2,local_12b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2dca);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2dc9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2e28 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_2e30._0_4_ = 0;
    in_stack_ffffffffffffba58 = "0";
    in_stack_ffffffffffffba50 = local_2e30;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_2e10,local_2e20,0x86,1,2,&local_2e28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2e30 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2e81 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_2e83[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_2e83;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2e70,local_2e80,0x87,1,2,&local_2e81);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2e83 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_2ed9 = ArgsManager::GetBoolArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(bool)uVar3);
    local_2edb[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_2edb;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_2ec8,local_2ed8,0x88,1,2,&local_2ed9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_2edb + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffba64,in_stack_ffffffffffffba60));
  UniValue::UniValue(in_stack_ffffffffffffba68,in_stack_ffffffffffffba64,
                     (string *)in_stack_ffffffffffffba58);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_13f0,(int)local_1448,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"{}\"";
    in_stack_ffffffffffffba50 = "{}";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_2f20,local_2f30,0x8b,1,2,local_13f0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2f31);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_2f5a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_2f59);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2f98,local_2fb8,&local_2fc8,0x8c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetIntArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               (int64_t)in_stack_ffffffffffffba58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3051);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3090,local_30b0,&local_30c0,0x8d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3149);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3188,local_31a8,&local_31b8,0x8e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3241);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3280,local_32a0,&local_32b0,0x8f,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffba64,in_stack_ffffffffffffba60));
  UniValue::UniValue(in_stack_ffffffffffffba68,in_stack_ffffffffffffba64,
                     (string *)in_stack_ffffffffffffba58);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_15c0,(int)local_1618,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"[]\"";
    in_stack_ffffffffffffba50 = "[]";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
              (local_3358,local_3368,0x92,1,2,local_15c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_3369);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_3392);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3391);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_33d0,local_33f0,&local_3400,0x93,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetIntArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               (int64_t)in_stack_ffffffffffffba58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3489);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_34c8,local_34e8,&local_34f8,0x94,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3581);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_35c0,local_35e0,&local_35f0,0x95,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetBoolArg
              ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
               SUB81((ulong)in_stack_ffffffffffffba58 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(local_3679);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffba88,
                 (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
                 (const_string *)
                 CONCAT17(in_stack_ffffffffffffba77,
                          CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffba58,
                 SUB81((ulong)in_stack_ffffffffffffba50 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [53])in_stack_ffffffffffffba48)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
                 (unsigned_long)in_stack_ffffffffffffba48);
      in_stack_ffffffffffffba48 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_36b8,local_36d8,&local_36e8,0x96,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffba48);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffba48);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffba64,in_stack_ffffffffffffba60));
  UniValue::UniValue(in_stack_ffffffffffffba68,in_stack_ffffffffffffba64,
                     (string *)in_stack_ffffffffffffba58);
  test_method::anon_class_8_1_89897ddb::operator()
            ((anon_class_8_1_89897ddb *)in_stack_ffffffffffffba50,
             (SettingsValue *)in_stack_ffffffffffffba48);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffba48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetSetting(in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98);
    UniValue::write_abi_cxx11_(local_1790,(int)local_17e8,(void *)0x0,0);
    in_stack_ffffffffffffba58 = "\"null\"";
    in_stack_ffffffffffffba50 = "null";
    in_stack_ffffffffffffba48 = "args.GetSetting(\"foo\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_3790,local_37a0,0x99,1,2,local_1790);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_37a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    ArgsManager::GetArg(in_stack_ffffffffffffba88,&in_stack_ffffffffffffba80->first,
                        in_stack_ffffffffffffba78);
    in_stack_ffffffffffffba58 = "\"default\"";
    in_stack_ffffffffffffba50 = "default";
    in_stack_ffffffffffffba48 = "args.GetArg(\"foo\", \"default\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_37e8,local_37f8,0x9a,1,2,local_1828);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_37fa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator(&local_37f9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffba98,
               (char *)CONCAT17(in_stack_ffffffffffffba97,
                                CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90)),
               (allocator<char> *)in_stack_ffffffffffffba88);
    local_3858 = ArgsManager::GetIntArg
                           ((ArgsManager *)in_stack_ffffffffffffba50,
                            (string *)in_stack_ffffffffffffba48,(int64_t)in_stack_ffffffffffffba58);
    local_3860._0_4_ = 100;
    in_stack_ffffffffffffba58 = "100";
    in_stack_ffffffffffffba50 = local_3860;
    in_stack_ffffffffffffba48 = "args.GetIntArg(\"foo\", 100)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_3840,local_3850,0x9b,1,2,&local_3858);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)(local_3860 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffba88,
               (const_string *)in_stack_ffffffffffffba80,(size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)local_38b3 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffba97,
                                        CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90
                                                )),(allocator<char> *)in_stack_ffffffffffffba88);
    in_stack_ffffffffffffba97 =
         ArgsManager::GetBoolArg
                   ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
                    (bool)uVar3);
    local_38b3[0] = '\x01';
    in_stack_ffffffffffffba58 = "true";
    in_stack_ffffffffffffba50 = local_38b3;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", true)";
    local_38b3[2] = in_stack_ffffffffffffba97;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_38b3 + 0x13),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_38b3 + 3),0x9c,1,2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_38b3 + 2));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)((long)local_38b3 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    in_stack_ffffffffffffba96 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffba96);
  do {
    __a = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,(const_string *)in_stack_ffffffffffffba80,
               (size_t)in_stack_ffffffffffffba78,
               (const_string *)
               CONCAT17(in_stack_ffffffffffffba77,
                        CONCAT16(in_stack_ffffffffffffba76,in_stack_ffffffffffffba70)));
    in_stack_ffffffffffffba80 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffba50,(char (*) [1])in_stack_ffffffffffffba48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffba58,in_stack_ffffffffffffba50,
               (unsigned_long)in_stack_ffffffffffffba48);
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffba58 >> 0x38);
    in_stack_ffffffffffffba78 = (string *)((long)local_390b + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffba97,
                                        CONCAT16(in_stack_ffffffffffffba96,in_stack_ffffffffffffba90
                                                )),__a);
    in_stack_ffffffffffffba77 =
         ArgsManager::GetBoolArg
                   ((ArgsManager *)in_stack_ffffffffffffba50,(string *)in_stack_ffffffffffffba48,
                    (bool)uVar3);
    local_390b[0] = '\0';
    in_stack_ffffffffffffba58 = "false";
    in_stack_ffffffffffffba50 = local_390b;
    in_stack_ffffffffffffba48 = "args.GetBoolArg(\"foo\", false)";
    local_390b[2] = in_stack_ffffffffffffba77;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((string *)((long)local_390b + 0x13),(string *)((long)local_390b + 3),0x9d,1,2,
               (string *)((long)local_390b + 2));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffba48);
    std::allocator<char>::~allocator((allocator<char> *)((long)local_390b + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffba48);
    in_stack_ffffffffffffba76 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffba76);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_ffffffffffffba48);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(setting_args)
{
    ArgsManager args;
    SetupArgs(args, {{"-foo", ArgsManager::ALLOW_ANY}});

    auto set_foo = [&](const common::SettingsValue& value) {
      args.LockSettings([&](common::Settings& settings) {
        settings.rw_settings["foo"] = value;
      });
    };

    set_foo("str");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"str\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "str");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("99");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"99\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("3.25");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"3.25\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 3);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo("0");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"0\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo("");
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "\"\"");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(99);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "99");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "99");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 99);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(3.25);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "3.25");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "3.25");
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(0);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "0");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(true);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "true");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "1");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 1);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), true);

    set_foo(false);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "false");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "0");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 0);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), false);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);

    set_foo(UniValue::VOBJ);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "{}");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VARR);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "[]");
    BOOST_CHECK_THROW(args.GetArg("foo", "default"), std::runtime_error);
    BOOST_CHECK_THROW(args.GetIntArg("foo", 100), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", true), std::runtime_error);
    BOOST_CHECK_THROW(args.GetBoolArg("foo", false), std::runtime_error);

    set_foo(UniValue::VNULL);
    BOOST_CHECK_EQUAL(args.GetSetting("foo").write(), "null");
    BOOST_CHECK_EQUAL(args.GetArg("foo", "default"), "default");
    BOOST_CHECK_EQUAL(args.GetIntArg("foo", 100), 100);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", true), true);
    BOOST_CHECK_EQUAL(args.GetBoolArg("foo", false), false);
}